

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void * get_proc(char *namez)

{
  char *in_RDI;
  void *result;
  void *local_18;
  void *local_8;
  
  local_18 = (void *)0x0;
  if (libGL == (void *)0x0) {
    local_8 = (void *)0x0;
  }
  else {
    if (gladGetProcAddressPtr != (PFNGLXGETPROCADDRESSPROC_PRIVATE)0x0) {
      local_18 = (*gladGetProcAddressPtr)(in_RDI);
    }
    if (local_18 == (void *)0x0) {
      local_18 = (void *)dlsym(libGL,in_RDI);
    }
    local_8 = local_18;
  }
  return local_8;
}

Assistant:

static
void* get_proc(const char *namez) {
    void* result = NULL;
    if(libGL == NULL) return NULL;

#ifndef __APPLE__
    if(gladGetProcAddressPtr != NULL) {
        result = gladGetProcAddressPtr(namez);
    }
#endif
    if(result == NULL) {
#ifdef _WIN32
        result = (void*)GetProcAddress(libGL, namez);
#else
        result = dlsym(libGL, namez);
#endif
    }

    return result;
}